

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O2

void __thiscall
cereal::OutputArchive<cereal::PortableBinaryOutputArchive,1u>::
process<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&>
          (OutputArchive<cereal::PortableBinaryOutputArchive,1u> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *head,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_1,int *tail_2)

{
  process<std::__cxx11::string&>
            (*(OutputArchive<cereal::PortableBinaryOutputArchive,1u> **)(this + 8),head);
  process<std::__cxx11::string&,std::__cxx11::string&,int&>
            (*(OutputArchive<cereal::PortableBinaryOutputArchive,1u> **)(this + 8),tail,tail_1,
             tail_2);
  return;
}

Assistant:

inline
      void process( T && head, Other && ... tail )
      {
        self->process( std::forward<T>( head ) );
        self->process( std::forward<Other>( tail )... );
      }